

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::activateLinkUnderCursor(QWidgetTextControlPrivate *this,QString *href)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MoveMode MVar5;
  ulong uVar6;
  QString *in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  int fragmentPos;
  int cursorPos;
  QTextFragment fragment_2;
  QTextFragment fragment_1;
  QTextFragment fragment;
  QTextCursor tmp;
  QTextCursor oldCursor;
  Iterator linkFragment;
  Iterator it;
  QTextBlock block;
  QString *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  QTextCursor *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  QUrl local_148 [4];
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_b8;
  undefined1 *local_b0 [3];
  iterator local_98;
  iterator local_70;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 local_40 [16];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0[0] = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)local_b0,&in_RDI->cursor);
  bVar1 = QString::isEmpty((QString *)0x718cc2);
  if (bVar1) {
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_b8,&in_RDI->cursor);
    in_stack_fffffffffffffe84 = QTextCursor::selectionStart();
    iVar2 = QTextCursor::position();
    if (in_stack_fffffffffffffe84 != iVar2) {
      MVar5 = QTextCursor::selectionStart();
      QTextCursor::setPosition((int)&local_b8,MVar5);
    }
    QTextCursor::movePosition((MoveOperation)&local_b8,0x11,0);
    QTextCursor::charFormat();
    QTextCharFormat::anchorHref((QTextCharFormat *)in_stack_fffffffffffffe48);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe48);
    QString::~QString((QString *)0x718d9b);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x718da8);
    QTextCursor::~QTextCursor((QTextCursor *)&local_b8);
  }
  bVar1 = QString::isEmpty((QString *)0x718dbf);
  if (!bVar1) {
    uVar6 = QTextCursor::hasSelection();
    if ((uVar6 & 1) == 0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::block();
      iVar2 = QTextCursor::position();
      local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::begin();
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::iterator::iterator((iterator *)local_58);
      while (bVar1 = QTextBlock::iterator::atEnd((iterator *)local_40), ((bVar1 ^ 0xffU) & 1) != 0)
      {
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::iterator::fragment();
        iVar3 = QTextFragment::position();
        if ((iVar3 <= iVar2) &&
           (iVar4 = QTextFragment::length(), in_stack_fffffffffffffe80 = iVar3,
           iVar2 < iVar3 + iVar4)) {
          local_58._0_8_ = local_40._0_8_;
          local_58._8_8_ = local_40._8_8_;
          local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_30);
          break;
        }
        QTextBlock::iterator::operator++((iterator *)local_40);
      }
      bVar1 = QTextBlock::iterator::atEnd((iterator *)local_58);
      if (!bVar1) {
        local_40._0_8_ = local_58._0_8_;
        local_40._8_8_ = local_58._8_8_;
        local_30 = (undefined1 *)CONCAT44(local_30._4_4_,(int)local_48);
        in_stack_fffffffffffffe78 = &in_RDI->cursor;
        QTextBlock::iterator::fragment();
        MVar5 = QTextFragment::position();
        QTextCursor::setPosition((int)in_stack_fffffffffffffe78,MVar5);
        QTextBlock::begin();
        bVar1 = QTextBlock::iterator::operator!=((iterator *)local_40,&local_70);
        if (bVar1) {
          do {
            QTextBlock::iterator::operator--((iterator *)local_40);
            local_100 = &DAT_aaaaaaaaaaaaaaaa;
            local_f8 = &DAT_aaaaaaaaaaaaaaaa;
            QTextBlock::iterator::fragment();
            QTextFragment::charFormat();
            QTextCharFormat::anchorHref((QTextCharFormat *)in_stack_fffffffffffffe48);
            bVar1 = ::operator!=((QString *)
                                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                 in_stack_fffffffffffffe48);
            QString::~QString((QString *)0x7190c5);
            QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7190d2);
            if (bVar1) break;
            MVar5 = QTextFragment::position();
            QTextCursor::setPosition((int)in_RDI + 0x88,MVar5);
            QTextBlock::begin();
            bVar1 = QTextBlock::iterator::operator!=((iterator *)local_40,&local_98);
          } while (bVar1);
        }
        local_40._0_8_ = local_58._0_8_;
        local_40._8_8_ = local_58._8_8_;
        local_30 = (undefined1 *)CONCAT44(local_30._4_4_,(int)local_48);
        while (bVar1 = QTextBlock::iterator::atEnd((iterator *)local_40), ((bVar1 ^ 0xffU) & 1) != 0
              ) {
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          local_120 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          QTextFragment::charFormat();
          QTextCharFormat::anchorHref((QTextCharFormat *)in_stack_fffffffffffffe48);
          bVar1 = ::operator!=((QString *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe48);
          QString::~QString((QString *)0x7191fa);
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x719207);
          if (bVar1) break;
          in_stack_fffffffffffffe54 = QTextFragment::position();
          iVar2 = QTextFragment::length();
          QTextCursor::setPosition((int)in_RDI + 0x88,in_stack_fffffffffffffe54 + iVar2);
          QTextBlock::iterator::operator++((iterator *)local_40);
        }
      }
    }
    if ((in_RDI->hasFocus & 1U) == 0) {
      in_RDI->cursorIsFocusIndicator = false;
      QTextCursor::clearSelection();
    }
    else {
      in_RDI->cursorIsFocusIndicator = true;
    }
    repaintOldAndNewSelection
              ((QWidgetTextControlPrivate *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    if ((in_RDI->openExternalLinks & 1U) == 0) {
      q_func(in_RDI);
      QWidgetTextControl::linkActivated
                ((QWidgetTextControl *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                 ,in_stack_fffffffffffffe48);
    }
    else {
      QUrl::QUrl(local_148,in_RSI,TolerantMode);
      QDesktopServices::openUrl((QUrl *)local_148);
      QUrl::~QUrl(local_148);
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::activateLinkUnderCursor(QString href)
{
    QTextCursor oldCursor = cursor;

    if (href.isEmpty()) {
        QTextCursor tmp = cursor;
        if (tmp.selectionStart() != tmp.position())
            tmp.setPosition(tmp.selectionStart());
        tmp.movePosition(QTextCursor::NextCharacter);
        href = tmp.charFormat().anchorHref();
    }
    if (href.isEmpty())
        return;

    if (!cursor.hasSelection()) {
        QTextBlock block = cursor.block();
        const int cursorPos = cursor.position();

        QTextBlock::Iterator it = block.begin();
        QTextBlock::Iterator linkFragment;

        for (; !it.atEnd(); ++it) {
            QTextFragment fragment = it.fragment();
            const int fragmentPos = fragment.position();
            if (fragmentPos <= cursorPos &&
                fragmentPos + fragment.length() > cursorPos) {
                linkFragment = it;
                break;
            }
        }

        if (!linkFragment.atEnd()) {
            it = linkFragment;
            cursor.setPosition(it.fragment().position());
            if (it != block.begin()) {
                do {
                    --it;
                    QTextFragment fragment = it.fragment();
                    if (fragment.charFormat().anchorHref() != href)
                        break;
                    cursor.setPosition(fragment.position());
                } while (it != block.begin());
            }

            for (it = linkFragment; !it.atEnd(); ++it) {
                QTextFragment fragment = it.fragment();
                if (fragment.charFormat().anchorHref() != href)
                    break;
                cursor.setPosition(fragment.position() + fragment.length(), QTextCursor::KeepAnchor);
            }
        }
    }

    if (hasFocus) {
        cursorIsFocusIndicator = true;
    } else {
        cursorIsFocusIndicator = false;
        cursor.clearSelection();
    }
    repaintOldAndNewSelection(oldCursor);

#ifndef QT_NO_DESKTOPSERVICES
    if (openExternalLinks)
        QDesktopServices::openUrl(href);
    else
#endif
        emit q_func()->linkActivated(href);
}